

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O2

value_type * __thiscall
FadBinaryDiv<Fad<Fad<double>_>,_FadCst<double>_>::fastAccessDx
          (value_type *__return_storage_ptr__,FadBinaryDiv<Fad<Fad<double>_>,_FadCst<double>_> *this
          ,int i)

{
  FadExpr<FadBinaryDiv<Fad<double>,_FadCst<double>_>_> local_20;
  
  local_20.fadexpr_.left_ = (this->left_->dx_).ptr_to_data + i;
  local_20.fadexpr_.right_.constant_ = (this->right_).constant_;
  local_20.fadexpr_.right_.defaultVal = 0.0;
  Fad<double>::Fad<FadBinaryDiv<Fad<double>,FadCst<double>>>(__return_storage_ptr__,&local_20);
  return __return_storage_ptr__;
}

Assistant:

value_type fastAccessDx(int i) const { return left_.fastAccessDx(i) / right_.val() ;}